

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManMonitor.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::DataManMonitor::AddCompression
          (DataManMonitor *this,string *method,string *accuracyUsed)

{
  ulong uVar1;
  string *in_RSI;
  string *in_RDI;
  float fVar2;
  size_t *in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::operator=((string *)&in_RDI[0xc]._M_string_length,in_RSI);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    fVar2 = std::__cxx11::stof(in_RDI,in_stack_ffffffffffffffd8);
    *(float *)&in_RDI[0xd]._M_string_length = fVar2;
  }
  return;
}

Assistant:

void DataManMonitor::AddCompression(const std::string &method, const std::string &accuracyUsed)
{
    m_CompressionMethod = method;

    if (!accuracyUsed.empty())
    {
        m_CompressionAccuracy = std::stof(accuracyUsed);
    }
}